

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt tt_cmap2_char_index(TT_CMap cmap,FT_UInt32 char_code)

{
  short sVar1;
  uint uVar2;
  FT_Byte *pFVar3;
  FT_Byte *pFVar4;
  FT_UInt offset;
  FT_Int delta;
  FT_UInt count;
  FT_UInt start;
  FT_UInt idx;
  FT_Byte *p;
  FT_Byte *subheader;
  FT_UInt result;
  FT_Byte *table;
  FT_UInt32 char_code_local;
  TT_CMap cmap_local;
  
  subheader._4_4_ = 0;
  pFVar3 = tt_cmap2_get_subheader(cmap->data,char_code);
  if (pFVar3 != (FT_Byte *)0x0) {
    pFVar4 = pFVar3 + 6;
    uVar2 = (char_code & 0xff) - (uint)CONCAT11(*pFVar3,pFVar3[1]);
    if (((uVar2 < CONCAT11(pFVar3[2],pFVar3[3])) && (CONCAT11(*pFVar4,pFVar3[7]) != 0)) &&
       (sVar1 = CONCAT11(pFVar4[(uint)CONCAT11(*pFVar4,pFVar3[7]) + uVar2 * 2],
                         (pFVar4 + ((uint)CONCAT11(*pFVar4,pFVar3[7]) + uVar2 * 2))[1]), sVar1 != 0)
       ) {
      subheader._4_4_ = (uint)(ushort)(sVar1 + CONCAT11(pFVar3[4],pFVar3[5]));
    }
  }
  return subheader._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  tt_cmap2_char_index( TT_CMap    cmap,
                       FT_UInt32  char_code )
  {
    FT_Byte*  table   = cmap->data;
    FT_UInt   result  = 0;
    FT_Byte*  subheader;


    subheader = tt_cmap2_get_subheader( table, char_code );
    if ( subheader )
    {
      FT_Byte*  p   = subheader;
      FT_UInt   idx = (FT_UInt)( char_code & 0xFF );
      FT_UInt   start, count;
      FT_Int    delta;
      FT_UInt   offset;


      start  = TT_NEXT_USHORT( p );
      count  = TT_NEXT_USHORT( p );
      delta  = TT_NEXT_SHORT ( p );
      offset = TT_PEEK_USHORT( p );

      idx -= start;
      if ( idx < count && offset != 0 )
      {
        p  += offset + 2 * idx;
        idx = TT_PEEK_USHORT( p );

        if ( idx != 0 )
          result = (FT_UInt)( (FT_Int)idx + delta ) & 0xFFFFU;
      }
    }

    return result;
  }